

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_fixture.c
# Opt level: O3

REF_STATUS
ref_fixture_hex_brick_args_grid
          (REF_GRID_conflict *ref_grid_ptr,REF_MPI ref_mpi,REF_DBL x0,REF_DBL x1,REF_DBL y0,
          REF_DBL y1,REF_DBL z0,REF_DBL z1,REF_INT l,REF_INT m,REF_INT n,REF_INT l0)

{
  REF_DBL *pRVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  undefined8 uVar6;
  ulong uVar7;
  ulong uVar8;
  REF_NODE ref_node;
  char *pcVar9;
  REF_GRID_conflict pRVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  int iVar16;
  long lVar17;
  int iVar18;
  int iVar19;
  ulong uVar20;
  REF_INT hex [8];
  REF_INT cell;
  REF_INT node;
  int local_108;
  int local_104;
  int local_100;
  int local_fc;
  undefined4 local_f8;
  double local_e8;
  REF_GRID_conflict local_e0;
  int local_d8;
  int local_d4;
  int local_d0;
  int local_cc;
  int local_c8;
  int local_c4;
  int local_c0;
  int local_bc;
  ulong local_b0;
  REF_INT local_a4;
  ulong local_a0;
  double local_98;
  REF_NODE local_90;
  double local_88;
  double local_80;
  ulong local_78;
  REF_DBL local_70;
  REF_DBL local_68;
  double local_60;
  int local_54;
  ulong local_50;
  long local_48;
  ulong local_40;
  int local_34;
  
  uVar20 = (ulong)(uint)m;
  uVar8 = (ulong)(uint)l;
  uVar3 = 0;
  if (0 < l0) {
    uVar3 = l0;
  }
  uVar15 = l - 1;
  if ((int)uVar15 <= (int)uVar3) {
    uVar3 = uVar15;
  }
  uVar13 = (ulong)uVar3;
  local_e8 = x1;
  local_98 = y1;
  local_90 = (REF_NODE)x0;
  local_88 = z1;
  local_80 = z0;
  local_60 = y0;
  uVar3 = ref_grid_create(ref_grid_ptr,ref_mpi);
  if (uVar3 == 0) {
    pRVar10 = *ref_grid_ptr;
    ref_node = pRVar10->node;
    local_40 = uVar13;
    if (pRVar10->mpi->id == 0) {
      uVar3 = n - 1;
      uVar13 = (ulong)uVar3;
      local_e0 = pRVar10;
      local_b0 = uVar20;
      if (n < 1) {
LAB_00124d34:
        local_a0 = (ulong)(uint)(m * l);
      }
      else {
        local_e8 = (local_e8 - (double)local_90) / (double)(int)uVar15;
        local_50 = (ulong)(m - 1U);
        local_98 = (local_98 - local_60) / (double)(int)(m - 1U);
        local_88 = (local_88 - local_80) / (double)(int)uVar3;
        local_a0 = (ulong)(uint)(m * l);
        local_48 = 0;
        local_54 = 0;
        local_78 = (ulong)uVar3;
        do {
          if (0 < (int)uVar20) {
            local_70 = (double)local_54 * local_88 + local_80;
            iVar11 = 0;
            lVar17 = local_48;
            do {
              if (0 < l) {
                local_68 = (double)iVar11 * local_98 + local_60;
                uVar20 = 0;
                do {
                  uVar3 = ref_node_add(ref_node,(long)((int)lVar17 + (int)uVar20),&local_34);
                  if (uVar3 != 0) {
                    pcVar9 = "node";
                    uVar6 = 0x514;
                    goto LAB_00124a96;
                  }
                  pRVar1 = ref_node->real;
                  lVar5 = (long)local_34;
                  pRVar1[lVar5 * 0xf] = (double)(int)uVar20 * local_e8 + (double)local_90;
                  pRVar1[lVar5 * 0xf + 1] = local_68;
                  pRVar1[lVar5 * 0xf + 2] = local_70;
                  uVar20 = uVar20 + 1;
                } while (uVar8 != uVar20);
              }
              iVar11 = iVar11 + 1;
              lVar17 = lVar17 + uVar8;
              uVar20 = local_b0;
            } while (iVar11 != (int)local_b0);
          }
          m = (REF_INT)uVar20;
          local_54 = local_54 + 1;
          local_48 = local_48 + local_a0;
        } while (local_54 != n);
        uVar13 = local_78;
        if (n == 1) goto LAB_00124d34;
        local_80 = (double)(ulong)(m + 1U);
        local_70 = (REF_DBL)CONCAT44(local_70._4_4_,l * (m + 1U));
        local_68 = (REF_DBL)CONCAT44(local_68._4_4_,1);
        local_98 = (double)((ulong)local_98 & 0xffffffff00000000);
        local_88 = (double)CONCAT44(local_88._4_4_,(int)local_a0);
        local_60 = (double)CONCAT44(local_60._4_4_,l);
        pRVar10 = local_e0;
        local_90 = ref_node;
        do {
          if (1 < (int)uVar20) {
            local_e8 = (double)CONCAT44(local_e8._4_4_,1);
            uVar13 = (ulong)local_98 & 0xffffffff;
            iVar11 = local_60._0_4_;
            iVar18 = local_88._0_4_;
            iVar16 = local_70._0_4_;
            do {
              iVar19 = (int)uVar13;
              if (1 < l) {
                uVar12 = 0;
                do {
                  local_d8 = iVar19 + uVar12;
                  local_d4 = iVar19 + uVar12 + 1;
                  local_cc = iVar11 + uVar12;
                  local_d0 = iVar11 + 1 + uVar12;
                  local_c8 = iVar18 + uVar12;
                  local_c4 = iVar18 + 1 + uVar12;
                  local_bc = iVar16 + uVar12;
                  local_c0 = iVar16 + 1 + uVar12;
                  uVar3 = ref_cell_add(pRVar10->cell[0xb],&local_d8,&local_a4);
                  if (uVar3 != 0) {
                    pcVar9 = "hex";
                    uVar6 = 0x528;
                    goto LAB_00124a96;
                  }
                  uVar12 = uVar12 + 1;
                  pRVar10 = local_e0;
                } while (uVar15 != uVar12);
              }
              iVar4 = local_e8._0_4_ + 1;
              iVar16 = iVar16 + l;
              iVar11 = iVar11 + l;
              iVar18 = iVar18 + l;
              uVar13 = (ulong)(uint)(iVar19 + l);
              local_e8 = (double)CONCAT44(local_e8._4_4_,iVar4);
              uVar20 = local_b0;
            } while (iVar4 != (int)local_b0);
          }
          iVar18 = local_68._0_4_ + 1;
          iVar11 = (int)local_a0;
          local_70 = (REF_DBL)CONCAT44(local_70._4_4_,local_70._0_4_ + iVar11);
          local_60 = (double)CONCAT44(local_60._4_4_,local_60._0_4_ + iVar11);
          local_88 = (double)CONCAT44(local_88._4_4_,local_88._0_4_ + iVar11);
          local_98 = (double)CONCAT44(local_98._4_4_,local_98._0_4_ + iVar11);
          local_68 = (REF_DBL)CONCAT44(local_68._4_4_,iVar18);
        } while (iVar18 != n);
        local_f8 = 1;
        if (n == 1) {
          m = (REF_INT)local_b0;
          uVar13 = local_78;
          ref_node = local_90;
        }
        else {
          iVar18 = l * local_80._0_4_;
          iVar11 = 1;
          iVar16 = 0;
          do {
            uVar20 = local_50 & 0xffffffff;
            iVar19 = iVar16;
            if (1 < (int)local_b0) {
              do {
                local_108 = iVar19;
                local_d4 = local_108 + 1;
                local_d0 = l + 1 + local_108;
                local_fc = (int)local_a0 + local_108;
                local_c4 = (int)local_a0 + 1 + local_108;
                local_100 = iVar18 + local_108;
                local_c0 = iVar18 + 1 + local_108;
                iVar19 = l + local_108;
                local_104 = iVar19;
                local_d8 = local_108;
                local_cc = iVar19;
                local_c8 = local_fc;
                local_bc = local_100;
                uVar3 = ref_cell_add(local_e0->cell[6],&local_108,&local_a4);
                if (uVar3 != 0) {
                  pcVar9 = "qua";
                  uVar6 = 0x534;
                  goto LAB_00124a96;
                }
                uVar3 = (int)uVar20 - 1;
                uVar20 = (ulong)uVar3;
              } while (uVar3 != 0);
            }
            iVar11 = iVar11 + 1;
            iVar16 = iVar16 + (int)local_a0;
          } while (iVar11 != n);
          local_f8 = 2;
          m = (REF_INT)local_b0;
          uVar13 = local_78;
          ref_node = local_90;
          if (n != 1) {
            local_88 = (double)CONCAT44(local_88._4_4_,1);
            local_70 = (REF_DBL)CONCAT44(local_70._4_4_,1 - m);
            local_60 = (double)CONCAT44(local_60._4_4_,(m + 2) * l);
            local_48 = CONCAT44(local_48._4_4_,l * 2);
            local_98 = 0.0;
            do {
              if (1 < (int)local_b0) {
                local_68 = (REF_DBL)(ulong)(SUB84(local_98,0) + 1);
                local_e8 = (double)((ulong)local_e8 & 0xffffffff00000000);
                uVar13 = (ulong)local_60 & 0xffffffff;
                uVar20 = uVar8;
                iVar11 = (int)local_48;
                iVar16 = iVar18;
                do {
                  iVar19 = SUB84(local_68,0);
                  iVar4 = (int)uVar20;
                  local_d8 = iVar19 + iVar4 + -3;
                  local_104 = iVar19 + -2 + iVar4;
                  local_108 = iVar19 + -2 + iVar11;
                  local_cc = iVar19 + -3 + iVar11;
                  local_c8 = iVar19 + -3 + iVar16;
                  local_100 = iVar19 + -2 + iVar16;
                  iVar2 = (int)uVar13;
                  local_fc = iVar19 + -2 + iVar2;
                  local_bc = iVar19 + -3 + iVar2;
                  local_d4 = local_104;
                  local_d0 = local_108;
                  local_c4 = local_100;
                  local_c0 = local_fc;
                  uVar3 = ref_cell_add(local_e0->cell[6],&local_108,&local_a4);
                  if (uVar3 != 0) {
                    pcVar9 = "qua";
                    uVar6 = 0x540;
                    goto LAB_00124a96;
                  }
                  iVar19 = local_e8._0_4_ + -1;
                  uVar13 = (ulong)(uint)(iVar2 + l);
                  iVar11 = iVar11 + l;
                  iVar16 = iVar16 + l;
                  uVar20 = (ulong)(uint)(iVar4 + l);
                  local_e8 = (double)CONCAT44(local_e8._4_4_,iVar19);
                } while (local_70._0_4_ != iVar19);
              }
              iVar11 = local_88._0_4_ + 1;
              local_98 = (double)(ulong)(uint)(SUB84(local_98,0) + (int)local_a0);
              local_88 = (double)CONCAT44(local_88._4_4_,iVar11);
            } while (iVar11 != n);
            local_f8 = 3;
            if (n == 1) {
              m = (REF_INT)local_b0;
              uVar13 = local_78;
              ref_node = local_90;
            }
            else {
              local_80 = (double)(ulong)(uint)(SUB84(local_80,0) * l);
              iVar18 = 1;
              iVar11 = 0;
              uVar20 = local_a0;
              uVar13 = uVar8;
              do {
                iVar19 = (int)uVar13;
                iVar16 = (int)uVar20;
                if (1 < l) {
                  uVar12 = 0;
                  do {
                    local_104 = iVar11 + uVar12;
                    local_108 = iVar11 + uVar12 + 1;
                    local_cc = iVar19 + uVar12;
                    local_d0 = iVar19 + 1 + uVar12;
                    local_100 = iVar16 + uVar12;
                    local_fc = iVar16 + 1 + uVar12;
                    local_bc = SUB84(local_80,0) + uVar12;
                    local_c0 = SUB84(local_80,0) + 1 + uVar12;
                    local_d8 = local_104;
                    local_d4 = local_108;
                    local_c8 = local_100;
                    local_c4 = local_fc;
                    uVar3 = ref_cell_add(local_e0->cell[6],&local_108,&local_a4);
                    if (uVar3 != 0) {
                      pcVar9 = "qua";
                      uVar6 = 0x54c;
                      goto LAB_00124a96;
                    }
                    uVar12 = uVar12 + 1;
                  } while (uVar15 != uVar12);
                }
                iVar18 = iVar18 + 1;
                iVar4 = (int)local_a0;
                uVar20 = (ulong)(uint)(iVar16 + iVar4);
                local_80 = (double)(ulong)(uint)(SUB84(local_80,0) + iVar4);
                uVar13 = (ulong)(uint)(iVar19 + iVar4);
                iVar11 = iVar11 + iVar4;
              } while (iVar18 != n);
              local_f8 = 4;
              if (n != 1) {
                iVar11 = (int)local_b0;
                iVar19 = (iVar11 + -2) * l;
                local_50 = (ulong)(uint)((int)local_50 * l);
                iVar18 = (iVar11 * 2 + -1) * l;
                iVar11 = (iVar11 * 2 + -2) * l;
                iVar16 = 1;
                do {
                  if (1 < l) {
                    uVar12 = 0;
                    do {
                      local_d8 = iVar19 + uVar12;
                      local_d4 = iVar19 + uVar12 + 1;
                      local_108 = (int)local_50 + uVar12;
                      local_104 = (int)local_50 + 1 + uVar12;
                      local_c8 = iVar11 + uVar12;
                      local_c4 = iVar11 + 1 + uVar12;
                      local_fc = iVar18 + uVar12;
                      local_100 = iVar18 + 1 + uVar12;
                      local_d0 = local_104;
                      local_cc = local_108;
                      local_c0 = local_100;
                      local_bc = local_fc;
                      uVar3 = ref_cell_add(local_e0->cell[6],&local_108,&local_a4);
                      if (uVar3 != 0) {
                        pcVar9 = "qua";
                        uVar6 = 0x558;
                        goto LAB_00124a96;
                      }
                      uVar12 = uVar12 + 1;
                    } while (uVar15 != uVar12);
                  }
                  iVar16 = iVar16 + 1;
                  iVar4 = (int)local_a0;
                  iVar18 = iVar18 + iVar4;
                  local_50 = (ulong)(uint)((int)local_50 + iVar4);
                  iVar11 = iVar11 + iVar4;
                  iVar19 = iVar19 + iVar4;
                } while (iVar16 != n);
              }
              m = (REF_INT)local_b0;
              uVar13 = local_78;
              ref_node = local_90;
            }
          }
        }
      }
      local_f8 = 7;
      if (m < 2) {
LAB_001250fa:
        local_f8 = 6;
      }
      else {
        iVar11 = (int)local_a0;
        iVar18 = 1;
        iVar16 = 0;
        uVar20 = local_40;
        uVar7 = local_a0;
        pRVar10 = local_e0;
        uVar14 = uVar8;
        local_90 = ref_node;
        local_78 = uVar13;
        do {
          iVar11 = iVar11 + l;
          local_e8 = (double)CONCAT44(local_e8._4_4_,iVar18);
          iVar4 = (int)uVar14;
          iVar19 = (int)uVar7;
          if (0 < (int)uVar20) {
            iVar18 = 0;
            do {
              local_108 = iVar18 + iVar16;
              local_104 = iVar18 + iVar16 + 1;
              local_fc = iVar4 + iVar18;
              local_100 = iVar4 + 1 + iVar18;
              local_c8 = iVar19 + iVar18;
              local_c4 = iVar19 + 1 + iVar18;
              local_bc = iVar11 + iVar18;
              local_c0 = iVar11 + 1 + iVar18;
              local_d8 = local_108;
              local_d4 = local_104;
              local_d0 = local_100;
              local_cc = local_fc;
              uVar3 = ref_cell_add(pRVar10->cell[6],&local_108,&local_a4);
              if (uVar3 != 0) {
                pcVar9 = "qua";
                uVar6 = 0x564;
                goto LAB_00124a96;
              }
              iVar18 = iVar18 + 1;
              uVar20 = local_40;
              pRVar10 = local_e0;
            } while ((int)local_40 != iVar18);
          }
          iVar18 = local_e8._0_4_ + 1;
          uVar14 = (ulong)(uint)(iVar4 + l);
          iVar16 = iVar16 + l;
          uVar7 = (ulong)(uint)(iVar19 + l);
        } while (iVar18 != (int)local_b0);
        local_f8 = 5;
        ref_node = local_90;
        if ((int)local_b0 < 2) goto LAB_001250fa;
        local_e8 = (double)CONCAT44(local_e8._4_4_,1);
        iVar18 = 0;
        uVar20 = local_a0 & 0xffffffff;
        iVar11 = (int)local_a0;
        do {
          uVar13 = local_40;
          iVar11 = iVar11 + l;
          iVar16 = 1;
          local_68 = (REF_DBL)CONCAT44(local_68._4_4_,iVar11);
          local_98 = (double)CONCAT44(local_98._4_4_,(int)uVar8);
          local_88 = (double)CONCAT44(local_88._4_4_,(int)uVar20);
          local_70 = (REF_DBL)CONCAT44(local_70._4_4_,iVar18);
          while (iVar19 = (int)uVar13, iVar19 + iVar16 < l) {
            local_108 = iVar19 + iVar18;
            local_104 = iVar19 + iVar18 + 1;
            iVar4 = (int)uVar8;
            local_fc = iVar19 + iVar4;
            local_100 = iVar19 + 1 + iVar4;
            iVar2 = (int)uVar20;
            local_c8 = iVar19 + iVar2;
            local_c4 = iVar19 + 1 + iVar2;
            local_bc = iVar19 + iVar11;
            local_c0 = iVar19 + 1 + iVar11;
            local_d8 = local_108;
            local_d4 = local_104;
            local_d0 = local_100;
            local_cc = local_fc;
            uVar3 = ref_cell_add(pRVar10->cell[6],&local_108,&local_a4);
            iVar18 = iVar18 + 1;
            uVar20 = (ulong)(iVar2 + 1);
            uVar8 = (ulong)(iVar4 + 1);
            iVar11 = iVar11 + 1;
            iVar16 = iVar16 + 1;
            pRVar10 = local_e0;
            if (uVar3 != 0) {
              pcVar9 = "qua";
              uVar6 = 0x570;
              goto LAB_00124a96;
            }
          }
          iVar16 = local_e8._0_4_ + 1;
          iVar18 = local_70._0_4_ + l;
          uVar20 = (ulong)(uint)(local_88._0_4_ + l);
          uVar8 = (ulong)(uint)(local_98._0_4_ + l);
          local_e8 = (double)CONCAT44(local_e8._4_4_,iVar16);
          iVar11 = local_68._0_4_;
        } while (iVar16 != (int)local_b0);
        local_f8 = 6;
        ref_node = local_90;
        if (1 < (int)local_b0) {
          iVar16 = (int)local_78 * (int)local_a0;
          iVar19 = (n + -2) * (int)local_a0;
          local_e8 = (double)CONCAT44(local_e8._4_4_,1);
          iVar11 = iVar19;
          iVar18 = iVar16;
          do {
            iVar18 = l + iVar18;
            iVar11 = l + iVar11;
            if (1 < l) {
              uVar12 = 0;
              do {
                local_d8 = iVar19 + uVar12;
                local_d4 = iVar19 + uVar12 + 1;
                local_cc = iVar11 + uVar12;
                local_d0 = iVar11 + 1 + uVar12;
                local_104 = iVar16 + uVar12;
                local_108 = iVar16 + 1 + uVar12;
                local_100 = iVar18 + uVar12;
                local_fc = iVar18 + 1 + uVar12;
                local_c8 = local_104;
                local_c4 = local_108;
                local_c0 = local_fc;
                local_bc = local_100;
                uVar3 = ref_cell_add(local_e0->cell[6],&local_108,&local_a4);
                if (uVar3 != 0) {
                  pcVar9 = "qua";
                  uVar6 = 0x57c;
                  goto LAB_00124a96;
                }
                uVar12 = uVar12 + 1;
              } while (uVar15 != uVar12);
            }
            iVar4 = local_e8._0_4_ + 1;
            iVar16 = iVar16 + l;
            iVar19 = iVar19 + l;
            local_e8 = (double)CONCAT44(local_e8._4_4_,iVar4);
            ref_node = local_90;
          } while (iVar4 != (int)local_b0);
        }
      }
      uVar3 = ref_node_initialize_n_global(ref_node,(long)((int)local_a0 * n));
      if (uVar3 != 0) {
        pcVar9 = "init glob";
        uVar6 = 0x57f;
        goto LAB_00124a96;
      }
    }
    else {
      uVar3 = ref_node_initialize_n_global(ref_node,(long)(m * l * n));
      if (uVar3 != 0) {
        pcVar9 = "init glob";
        uVar6 = 0x50a;
        goto LAB_00124a96;
      }
    }
    uVar3 = 0;
  }
  else {
    pcVar9 = "create";
    uVar6 = 0x505;
LAB_00124a96:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",uVar6
           ,"ref_fixture_hex_brick_args_grid",(ulong)uVar3,pcVar9);
  }
  return uVar3;
}

Assistant:

REF_FCN REF_STATUS ref_fixture_hex_brick_args_grid(
    REF_GRID *ref_grid_ptr, REF_MPI ref_mpi, REF_DBL x0, REF_DBL x1, REF_DBL y0,
    REF_DBL y1, REF_DBL z0, REF_DBL z1, REF_INT l, REF_INT m, REF_INT n,
    REF_INT l0) {
  REF_GRID ref_grid;
  REF_NODE ref_node;
  REF_INT global, node, hex[8], cell;
  REF_INT quad[5];

  REF_INT i, j, k;
  REF_DBL dx, dy, dz;

  l0 = MAX(0, l0);
  l0 = MIN(l0, l - 1);

  dx = (x1 - x0) / ((REF_DBL)(l - 1));
  dy = (y1 - y0) / ((REF_DBL)(m - 1));
  dz = (z1 - z0) / ((REF_DBL)(n - 1));

  RSS(ref_grid_create(ref_grid_ptr, ref_mpi), "create");
  ref_grid = *ref_grid_ptr;
  ref_node = ref_grid_node(ref_grid);

  if (!ref_mpi_once(ref_grid_mpi(ref_grid))) {
    RSS(ref_node_initialize_n_global(ref_node, l * m * n), "init glob");
    return REF_SUCCESS;
  }

#define ijk2node(i, j, k, l, m, n) ((i) + (j) * (l) + (k) * (l) * (m))

  for (k = 0; k < n; k++)
    for (j = 0; j < m; j++)
      for (i = 0; i < l; i++) {
        global = ijk2node(i, j, k, l, m, n);
        RSS(ref_node_add(ref_node, global, &node), "node");
        ref_node_xyz(ref_node, 0, node) = x0 + dx * (REF_DBL)i;
        ref_node_xyz(ref_node, 1, node) = y0 + dy * (REF_DBL)j;
        ref_node_xyz(ref_node, 2, node) = z0 + dz * (REF_DBL)k;
      }

#define ijk2hex(i, j, k, l, m, n, hex)                     \
  (hex)[0] = ijk2node((i)-1, (j)-1, (k)-1, (l), (m), (n)); \
  (hex)[1] = ijk2node((i), (j)-1, (k)-1, (l), (m), (n));   \
  (hex)[2] = ijk2node((i), (j), (k)-1, (l), (m), (n));     \
  (hex)[3] = ijk2node((i)-1, (j), (k)-1, (l), (m), (n));   \
  (hex)[4] = ijk2node((i)-1, (j)-1, (k), (l), (m), (n));   \
  (hex)[5] = ijk2node((i), (j)-1, (k), (l), (m), (n));     \
  (hex)[6] = ijk2node((i), (j), (k), (l), (m), (n));       \
  (hex)[7] = ijk2node((i)-1, (j), (k), (l), (m), (n));

  for (k = 1; k < n; k++)
    for (j = 1; j < m; j++)
      for (i = 1; i < l; i++) {
        ijk2hex(i, j, k, l, m, n, hex);
        RSS(ref_cell_add(ref_grid_hex(ref_grid), hex, &cell), "hex");
      }

  quad[4] = 1;
  i = 1;
  for (k = 1; k < n; k++)
    for (j = 1; j < m; j++) {
      ijk2hex(i, j, k, l, m, n, hex);
      quad[0] = hex[0];
      quad[1] = hex[3];
      quad[2] = hex[7];
      quad[3] = hex[4];
      RSS(ref_cell_add(ref_grid_qua(ref_grid), quad, &cell), "qua");
    }

  quad[4] = 2;
  i = l - 1;
  for (k = 1; k < n; k++)
    for (j = 1; j < m; j++) {
      ijk2hex(i, j, k, l, m, n, hex);
      quad[0] = hex[2];
      quad[1] = hex[1];
      quad[2] = hex[5];
      quad[3] = hex[6];
      RSS(ref_cell_add(ref_grid_qua(ref_grid), quad, &cell), "qua");
    }

  quad[4] = 3;
  j = 1;
  for (k = 1; k < n; k++)
    for (i = 1; i < l; i++) {
      ijk2hex(i, j, k, l, m, n, hex);
      quad[0] = hex[1];
      quad[1] = hex[0];
      quad[2] = hex[4];
      quad[3] = hex[5];
      RSS(ref_cell_add(ref_grid_qua(ref_grid), quad, &cell), "qua");
    }

  quad[4] = 4;
  j = m - 1;
  for (k = 1; k < n; k++)
    for (i = 1; i < l; i++) {
      ijk2hex(i, j, k, l, m, n, hex);
      quad[0] = hex[3];
      quad[1] = hex[2];
      quad[2] = hex[6];
      quad[3] = hex[7];
      RSS(ref_cell_add(ref_grid_qua(ref_grid), quad, &cell), "qua");
    }

  quad[4] = 7;
  k = 1;
  for (j = 1; j < m; j++)
    for (i = 1; i < l0 + 1; i++) {
      ijk2hex(i, j, k, l, m, n, hex);
      quad[0] = hex[0];
      quad[1] = hex[1];
      quad[2] = hex[2];
      quad[3] = hex[3];
      RSS(ref_cell_add(ref_grid_qua(ref_grid), quad, &cell), "qua");
    }

  quad[4] = 5;
  k = 1;
  for (j = 1; j < m; j++)
    for (i = l0 + 1; i < l; i++) {
      ijk2hex(i, j, k, l, m, n, hex);
      quad[0] = hex[0];
      quad[1] = hex[1];
      quad[2] = hex[2];
      quad[3] = hex[3];
      RSS(ref_cell_add(ref_grid_qua(ref_grid), quad, &cell), "qua");
    }

  quad[4] = 6;
  k = n - 1;
  for (j = 1; j < m; j++)
    for (i = 1; i < l; i++) {
      ijk2hex(i, j, k, l, m, n, hex);
      quad[0] = hex[5];
      quad[1] = hex[4];
      quad[2] = hex[7];
      quad[3] = hex[6];
      RSS(ref_cell_add(ref_grid_qua(ref_grid), quad, &cell), "qua");
    }

  RSS(ref_node_initialize_n_global(ref_node, l * m * n), "init glob");

  return REF_SUCCESS;
}